

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void Logger::log_timestamp(void)

{
  time_t tVar1;
  ostream *poVar2;
  unsigned_long ts;
  stringstream local_1c0 [8];
  stringstream ss;
  undefined1 local_1b0 [376];
  string local_38;
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  tVar1 = time((time_t *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Time elapsed: ",0xe);
  format_timestamp_abi_cxx11_(&local_38,(Logger *)(tVar1 - instance.timestamp_start),ts);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1b0,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  log_info(&local_38,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  return;
}

Assistant:

void Logger::log_timestamp() {
  std::stringstream ss;
  auto current_time = (unsigned long) time(nullptr);
  ss << "Time elapsed: "
     << format_timestamp(current_time - instance.timestamp_start)
     << ".";
  log_info(ss.str());
}